

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  byte *pbVar5;
  curl_trc_feat *pcVar6;
  _Bool _Var7;
  CURLcode CVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  char *local_40;
  uint local_34;
  
  local_34 = (uint)proxy;
  lVar4 = (ulong)!proxy * 8;
  uVar11 = (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5);
  local_40 = auth;
  do {
    if (*local_40 == '\0') {
      return CURLE_OK;
    }
    _Var7 = authcmp("NTLM",local_40);
    pcVar3 = local_40;
    if (_Var7) {
      uVar10 = *(ulong *)((long)&(data->state).authhost.avail + uVar11);
      if ((uVar10 & 8) == 0) {
        _Var7 = Curl_auth_is_ntlm_supported();
        if (!_Var7) goto LAB_0013449f;
        uVar10 = *(ulong *)((long)&(data->state).authhost.avail + uVar11);
      }
      pcVar2 = (data->info).primary.remote_ip + lVar4 + -0x44;
      *pcVar2 = *pcVar2 | 8;
      *(ulong *)((long)&(data->state).authhost.avail + uVar11) = uVar10 | 8;
      if (*(long *)((long)&(data->state).authhost.picked + uVar11) == 8) {
        CVar8 = Curl_input_ntlm(data,SUB41(local_34,0),pcVar3);
        if (CVar8 == CURLE_OK) {
          uVar9 = *(uint *)&(data->state).field_0x7be & 0xffffff7f;
        }
        else {
          if ((((data->set).field_0x897 & 0x40) != 0) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            Curl_infof(data,"NTLM authentication problem, ignoring.");
          }
          uVar9 = *(uint *)&(data->state).field_0x7be | 0x80;
        }
        *(uint *)&(data->state).field_0x7be = uVar9;
      }
    }
LAB_0013449f:
    _Var7 = authcmp("Digest",local_40);
    pcVar3 = local_40;
    if (_Var7) {
      if ((*(byte *)((long)&(data->state).authhost.avail + uVar11) & 2) == 0) {
        _Var7 = Curl_auth_is_digest_supported();
        if (_Var7) {
          pcVar2 = (data->info).primary.remote_ip + lVar4 + -0x44;
          *pcVar2 = *pcVar2 | 2;
          pbVar5 = (byte *)((long)&(data->state).authhost.avail + uVar11);
          *pbVar5 = *pbVar5 | 2;
          CVar8 = Curl_input_digest(data,SUB41(local_34,0),pcVar3);
          if (CVar8 != CURLE_OK) {
            if ((((data->set).field_0x897 & 0x40) != 0) &&
               ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                (0 < pcVar6->log_level)))) {
              Curl_infof(data,"Digest authentication problem, ignoring.");
            }
            puVar1 = &(data->state).field_0x7be;
            *puVar1 = *puVar1 | 0x80;
          }
        }
      }
      else if ((((data->set).field_0x897 & 0x40) != 0) &&
              ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
               (0 < pcVar6->log_level)))) {
        Curl_infof(data,"Ignoring duplicate digest auth header.");
      }
    }
    _Var7 = authcmp("Basic",local_40);
    if (_Var7) {
      pcVar3 = (data->info).primary.remote_ip + lVar4 + -0x44;
      *pcVar3 = *pcVar3 | 1;
      pbVar5 = (byte *)((long)&(data->state).authhost.avail + uVar11);
      *pbVar5 = *pbVar5 | 1;
      if (*(long *)((long)&(data->state).authhost.picked + uVar11) == 1) {
        *(undefined8 *)((long)&(data->state).authhost.avail + uVar11) = 0;
        if ((((data->set).field_0x897 & 0x40) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          Curl_infof(data,"Basic authentication problem, ignoring.");
        }
        puVar1 = &(data->state).field_0x7be;
        *puVar1 = *puVar1 | 0x80;
      }
    }
    _Var7 = authcmp("Bearer",local_40);
    if (_Var7) {
      pcVar3 = (data->info).primary.remote_ip + lVar4 + -0x44;
      *pcVar3 = *pcVar3 | 0x40;
      pbVar5 = (byte *)((long)&(data->state).authhost.avail + uVar11);
      *pbVar5 = *pbVar5 | 0x40;
      if (*(long *)((long)&(data->state).authhost.picked + uVar11) == 0x40) {
        *(undefined8 *)((long)&(data->state).authhost.avail + uVar11) = 0;
        if ((((data->set).field_0x897 & 0x40) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          Curl_infof(data,"Bearer authentication problem, ignoring.");
        }
        puVar1 = &(data->state).field_0x7be;
        *puVar1 = *puVar1 | 0x80;
      }
    }
    local_40 = strchr(local_40,0x2c);
    if (local_40 == (char *)0x0) {
      return CURLE_OK;
    }
    local_40 = local_40 + 1;
    Curl_str_passblanks(&local_40);
  } while( true );
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
#if defined(USE_SPNEGO) ||                      \
  defined(USE_NTLM) ||                          \
  !defined(CURL_DISABLE_DIGEST_AUTH) ||         \
  !defined(CURL_DISABLE_BASIC_AUTH) ||          \
  !defined(CURL_DISABLE_BEARER_AUTH)

  unsigned long *availp;
  struct auth *authp;
  CURLcode result = CURLE_OK;
  DEBUGASSERT(auth);
  DEBUGASSERT(data);

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(authcmp("Negotiate", auth))
      result = auth_spnego(data, proxy, auth, authp, availp);
#endif
#ifdef USE_NTLM
    if(!result && authcmp("NTLM", auth))
      result = auth_ntlm(data, proxy, auth, authp, availp);
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
    if(!result && authcmp("Digest", auth))
      result = auth_digest(data, proxy, auth, authp, availp);
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
    if(!result && authcmp("Basic", auth))
      result = auth_basic(data, authp, availp);
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
    if(authcmp("Bearer", auth))
      result = auth_bearer(data, authp, availp);
#endif

    if(result)
      break;

    /* there may be multiple methods on one line, so keep reading */
    auth = strchr(auth, ',');
    if(auth) /* if we are on a comma, skip it */
      auth++;
    else
      break;
    Curl_str_passblanks(&auth);
  }
  return result;
#else
  (void) proxy;
  /* nothing to do when disabled */
  return CURLE_OK;
#endif
}